

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O3

base_uint<256U> * __thiscall base_uint<256U>::operator+=(base_uint<256U> *this,uint64_t b64)

{
  int i;
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  base_uint<256U> b;
  base_uint<256U> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(&local_40);
  local_40.pn._0_8_ = b64;
  local_40.pn[2] = 0;
  local_40.pn[3] = 0;
  local_40.pn[4] = 0;
  local_40.pn[5] = 0;
  local_40.pn[6] = 0;
  local_40.pn[7] = 0;
  lVar1 = 0;
  uVar2 = 0;
  do {
    uVar2 = (ulong)local_40.pn[lVar1] + this->pn[lVar1] + uVar2;
    this->pn[lVar1] = (uint32_t)uVar2;
    uVar2 = uVar2 >> 0x20;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator+=(uint64_t b64)
    {
        base_uint b;
        b = b64;
        *this += b;
        return *this;
    }